

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnRefFuncExpr(BinaryReaderIR *this,Index func_index)

{
  Index index;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar1;
  Location local_a8;
  Var local_88;
  undefined1 local_40 [8];
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_38;
  anon_union_16_2_ecfd7102_for_Location_1 local_30;
  Index local_1c;
  undefined1 auStack_18 [4];
  Index func_index_local;
  BinaryReaderIR *this_local;
  
  local_1c = func_index;
  _auStack_18 = this;
  pVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    (&this->module_->used_func_refs,&local_1c);
  index = local_1c;
  local_30.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pVar1.first._M_node;
  local_30.field2[8] = pVar1.second;
  GetLocation(&local_a8,this);
  Var::Var(&local_88,index,&local_a8);
  std::make_unique<wabt::VarExpr<(wabt::ExprType)36>,wabt::Var>((Var *)local_40);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::VarExpr<(wabt::ExprType)36>,std::default_delete<wabt::VarExpr<(wabt::ExprType)36>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_38,
             (unique_ptr<wabt::VarExpr<(wabt::ExprType)36>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)36>_>_>
              *)local_40);
  this_local._4_4_ = AppendExpr(this,&local_38);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_38);
  std::
  unique_ptr<wabt::VarExpr<(wabt::ExprType)36>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)36>_>_>
  ::~unique_ptr((unique_ptr<wabt::VarExpr<(wabt::ExprType)36>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)36>_>_>
                 *)local_40);
  Var::~Var(&local_88);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnRefFuncExpr(Index func_index) {
  module_->used_func_refs.insert(func_index);
  return AppendExpr(
      std::make_unique<RefFuncExpr>(Var(func_index, GetLocation())));
}